

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceNextGenBase.hpp
# Opt level: O0

ICommandQueueVk * __thiscall
Diligent::
RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
::LockCommandQueue(RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                   *this,SoftwareQueueIndex QueueInd)

{
  CommandQueue *pCVar1;
  Uint32 UVar2;
  Char *Message;
  ICommandQueueVk *pIVar3;
  CommandQueue *Queue;
  undefined1 local_38 [8];
  string msg;
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
  *this_local;
  SoftwareQueueIndex QueueInd_local;
  
  msg.field_2._8_8_ = this;
  this_local._7_1_ = QueueInd.m_Value;
  UVar2 = IndexWrapper::operator_cast_to_unsigned_int((IndexWrapper *)((long)&this_local + 7));
  if (this->m_CmdQueueCount <= (ulong)UVar2) {
    FormatString<char[26],char[27]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",(char (*) [26])0xc108a8,
               (char (*) [27])this);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"LockCommandQueue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0x10f);
    std::__cxx11::string::~string((string *)local_38);
  }
  pCVar1 = this->m_CommandQueues;
  UVar2 = IndexWrapper::operator_cast_to_unsigned_int((IndexWrapper *)((long)&this_local + 7));
  std::mutex::lock(&pCVar1[UVar2].Mtx);
  pIVar3 = Diligent::RefCntAutoPtr::operator_cast_to_ICommandQueueVk_
                     ((RefCntAutoPtr *)&pCVar1[UVar2].CmdQueue);
  return pIVar3;
}

Assistant:

CommandQueueType* LockCommandQueue(SoftwareQueueIndex QueueInd)
    {
        VERIFY_EXPR(QueueInd < m_CmdQueueCount);
        auto& Queue = m_CommandQueues[QueueInd];
        Queue.Mtx.lock();
        return Queue.CmdQueue;
    }